

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_thread_sem.cc
# Opt level: O1

void absl::lts_20250127::synchronization_internal::PerThreadSem::Tick(ThreadIdentity *identity)

{
  atomic<int> *paVar1;
  int iVar2;
  int iVar3;
  
  LOCK();
  paVar1 = &identity->ticker;
  iVar2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  iVar3 = (identity->wait_start).super___atomic_base<int>._M_i;
  if (((iVar3 != 0) && (0x3c < (iVar2 - iVar3) + 1)) &&
     (((identity->is_idle)._M_base._M_i & 1U) == 0)) {
    FutexWaiter::Poke((FutexWaiter *)&identity->waiter_state);
    return;
  }
  return;
}

Assistant:

void PerThreadSem::Tick(base_internal::ThreadIdentity *identity) {
  const int ticker =
      identity->ticker.fetch_add(1, std::memory_order_relaxed) + 1;
  const int wait_start = identity->wait_start.load(std::memory_order_relaxed);
  const bool is_idle = identity->is_idle.load(std::memory_order_relaxed);
  if (wait_start && (ticker - wait_start > Waiter::kIdlePeriods) && !is_idle) {
    // Wakeup the waiting thread since it is time for it to become idle.
    ABSL_INTERNAL_C_SYMBOL(AbslInternalPerThreadSemPoke)(identity);
  }
}